

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# simple_svg.h
# Opt level: O2

string * __thiscall
svg::Document::toString_abi_cxx11_(string *__return_storage_ptr__,Document *this)

{
  ostream *poVar1;
  stringstream local_458 [8];
  stringstream ss;
  ostream local_448 [376];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2d0;
  string local_2b0;
  string local_290;
  string local_270;
  string local_250;
  string local_230;
  string local_210;
  string local_1f0;
  string local_1d0;
  string local_1b0;
  string local_190;
  string local_170;
  string local_150;
  string local_130;
  string local_110;
  string local_f0;
  string local_d0;
  string local_b0;
  string local_90;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  allocator local_2d;
  allocator local_2c;
  allocator local_2b;
  allocator local_2a;
  allocator local_29;
  allocator local_28;
  allocator local_27;
  allocator local_26;
  allocator local_25;
  allocator local_24;
  allocator local_23;
  allocator local_22;
  allocator local_21;
  
  std::__cxx11::stringstream::stringstream(local_458);
  poVar1 = std::operator<<(local_448,"<?xml ");
  std::__cxx11::string::string((string *)&local_290,"version",&local_2d);
  std::__cxx11::string::string((string *)&local_270,"",&local_2c);
  attribute<char[4]>(&local_2b0,&local_290,(char (*) [4])"1.0",&local_270);
  poVar1 = std::operator<<(poVar1,(string *)&local_2b0);
  std::__cxx11::string::string((string *)&local_230,"standalone",&local_2b);
  std::__cxx11::string::string((string *)&local_210,"",&local_2a);
  attribute<char[3]>(&local_250,&local_230,(char (*) [3])"no",&local_210);
  poVar1 = std::operator<<(poVar1,(string *)&local_250);
  poVar1 = std::operator<<(poVar1,"?>\n<!DOCTYPE svg PUBLIC \"-//W3C//DTD SVG 1.1//EN\" ");
  poVar1 = std::operator<<(poVar1,"\"http://www.w3.org/Graphics/SVG/1.1/DTD/svg11.dtd\">\n<svg ");
  std::__cxx11::string::string((string *)&local_1d0,"width",&local_29);
  std::__cxx11::string::string((string *)&local_1b0,"px",&local_28);
  attribute<double>(&local_1f0,&local_1d0,(double *)&this->layout,&local_1b0);
  poVar1 = std::operator<<(poVar1,(string *)&local_1f0);
  std::__cxx11::string::string((string *)&local_170,"height",&local_27);
  std::__cxx11::string::string((string *)&local_150,"px",&local_26);
  attribute<double>(&local_190,&local_170,&(this->layout).dimensions.height,&local_150);
  poVar1 = std::operator<<(poVar1,(string *)&local_190);
  std::__cxx11::string::string((string *)&local_110,"xmlns",&local_25);
  std::__cxx11::string::string((string *)&local_f0,"",&local_24);
  attribute<char[27]>(&local_130,&local_110,(char (*) [27])"http://www.w3.org/2000/svg",&local_f0);
  poVar1 = std::operator<<(poVar1,(string *)&local_130);
  std::__cxx11::string::string((string *)&local_b0,"version",&local_23);
  std::__cxx11::string::string((string *)&local_90,"",&local_22);
  attribute<char[4]>(&local_d0,&local_b0,(char (*) [4])"1.1",&local_90);
  poVar1 = std::operator<<(poVar1,(string *)&local_d0);
  poVar1 = std::operator<<(poVar1,">\n");
  poVar1 = std::operator<<(poVar1,(string *)&this->body_nodes_str);
  std::__cxx11::string::string((string *)&local_50,"svg",&local_21);
  std::operator+(&local_2d0,"</",&local_50);
  std::operator+(&local_70,&local_2d0,">\n");
  std::__cxx11::string::~string((string *)&local_2d0);
  std::operator<<(poVar1,(string *)&local_70);
  std::__cxx11::string::~string((string *)&local_70);
  std::__cxx11::string::~string((string *)&local_50);
  std::__cxx11::string::~string((string *)&local_d0);
  std::__cxx11::string::~string((string *)&local_90);
  std::__cxx11::string::~string((string *)&local_b0);
  std::__cxx11::string::~string((string *)&local_130);
  std::__cxx11::string::~string((string *)&local_f0);
  std::__cxx11::string::~string((string *)&local_110);
  std::__cxx11::string::~string((string *)&local_190);
  std::__cxx11::string::~string((string *)&local_150);
  std::__cxx11::string::~string((string *)&local_170);
  std::__cxx11::string::~string((string *)&local_1f0);
  std::__cxx11::string::~string((string *)&local_1b0);
  std::__cxx11::string::~string((string *)&local_1d0);
  std::__cxx11::string::~string((string *)&local_250);
  std::__cxx11::string::~string((string *)&local_210);
  std::__cxx11::string::~string((string *)&local_230);
  std::__cxx11::string::~string((string *)&local_2b0);
  std::__cxx11::string::~string((string *)&local_270);
  std::__cxx11::string::~string((string *)&local_290);
  std::__cxx11::stringbuf::str();
  std::__cxx11::stringstream::~stringstream(local_458);
  return __return_storage_ptr__;
}

Assistant:

std::string toString() const
        {
            std::stringstream ss;
            ss << "<?xml " << attribute("version", "1.0") << attribute("standalone", "no")
                << "?>\n<!DOCTYPE svg PUBLIC \"-//W3C//DTD SVG 1.1//EN\" "
                << "\"http://www.w3.org/Graphics/SVG/1.1/DTD/svg11.dtd\">\n<svg "
                << attribute("width", layout.dimensions.width, "px")
                << attribute("height", layout.dimensions.height, "px")
                << attribute("xmlns", "http://www.w3.org/2000/svg")
                << attribute("version", "1.1") << ">\n" << body_nodes_str << elemEnd("svg");
            return ss.str();
        }